

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-gl.c
# Opt level: O1

Result host_gl_shader(GLenum type,GLchar *source,GLuint *out_shader)

{
  GLuint GVar1;
  GLint status;
  GLchar *sources [2];
  char version [128];
  int local_cc;
  char *local_c8;
  GLchar *local_c0;
  char local_b8 [136];
  
  if ((type & 0xfffffffe) == 0x8b30) {
    GVar1 = (*glCreateShader)(type);
    host_gl_shader_version();
    snprintf(local_b8,0x7f,"#version %d\n");
    local_c8 = local_b8;
    local_c0 = source;
    (*glShaderSource)(GVar1,2,&local_c8,(GLint *)0x0);
    (*glCompileShader)(GVar1);
    (*glGetShaderiv)(GVar1,0x8b81,&local_cc);
    if (local_cc == 0) {
      host_gl_shader_cold_1();
    }
    else {
      *out_shader = GVar1;
    }
    return (uint)(local_cc == 0);
  }
  __assert_fail("type == GL_VERTEX_SHADER || type == GL_FRAGMENT_SHADER",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/host-gl.c",
                0x28,"Result host_gl_shader(GLenum, const GLchar *, GLuint *)");
}

Assistant:

Result host_gl_shader(GLenum type, const GLchar* source, GLuint* out_shader) {
  assert(type == GL_VERTEX_SHADER || type == GL_FRAGMENT_SHADER);
  GLuint shader = glCreateShader(type);
  char version[128];
  snprintf(version, sizeof(version) - 1, "#version %d\n",
           host_gl_shader_version());
  const GLchar* sources[] = {version, source};
  glShaderSource(shader, 2, sources, NULL);
  glCompileShader(shader);
  CHECK_LOG(shader, Shader, GL_COMPILE_STATUS, type == GL_VERTEX_SHADER
                                                   ? "GL_VERTEX_SHADER"
                                                   : "GL_FRAGMENT_SHADER");
  *out_shader = shader;
  return OK;
  ON_ERROR_RETURN;
}